

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_get_key_usage(uchar **p,uchar *end,uint *key_usage)

{
  int iVar1;
  ulong uVar2;
  undefined1 auVar3 [8];
  uint uVar4;
  undefined1 auStack_28 [8];
  mbedtls_x509_bitstring bs;
  
  auStack_28 = (undefined1  [8])0x0;
  bs.len = 0;
  bs.unused_bits = '\0';
  bs._9_7_ = 0;
  iVar1 = mbedtls_asn1_get_bitstring(p,end,(mbedtls_asn1_bitstring *)auStack_28);
  if (iVar1 == 0) {
    *key_usage = 0;
    if (auStack_28 == (undefined1  [8])0x0) {
      iVar1 = 0;
    }
    else {
      auVar3 = (undefined1  [8])4;
      if ((ulong)auStack_28 < 4) {
        auVar3 = auStack_28;
      }
      iVar1 = 0;
      uVar2 = 0;
      uVar4 = 0;
      do {
        uVar4 = uVar4 | (uint)*(byte *)bs._8_8_ << ((byte)uVar2 & 0x1f);
        *key_usage = uVar4;
        uVar2 = uVar2 + 8;
        bs._8_8_ = bs._8_8_ + 1;
      } while ((uint)(SUB84(auVar3,0) << 3) != uVar2);
    }
  }
  else {
    iVar1 = iVar1 + -0x2500;
  }
  return iVar1;
}

Assistant:

int mbedtls_x509_get_key_usage(unsigned char **p,
                               const unsigned char *end,
                               unsigned int *key_usage)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    mbedtls_x509_bitstring bs = { 0, 0, NULL };

    if ((ret = mbedtls_asn1_get_bitstring(p, end, &bs)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    /* A bitstring with no flags set is still technically valid, as it will mean
       that the certificate has no designated purpose at the time of creation. */
    if (bs.len == 0) {
        *key_usage = 0;
        return 0;
    }

    /* Get actual bitstring */
    *key_usage = 0;
    for (i = 0; i < bs.len && i < sizeof(unsigned int); i++) {
        *key_usage |= (unsigned int) bs.p[i] << (8*i);
    }

    return 0;
}